

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_sd_right_to_left<double,double>(double *x,size_t n,double *sd_arr)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (n == 1) {
    dVar6 = 0.0;
    dVar5 = 0.0;
    dVar8 = x[n - 1];
  }
  else {
    lVar2 = 1;
    dVar5 = 0.0;
    dVar6 = 0.0;
    lVar3 = 0;
    dVar8 = x[n - 1];
    do {
      dVar1 = x[n + lVar3 + -1];
      auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar10._0_8_ = lVar2;
      auVar10._12_4_ = 0x45300000;
      dVar7 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
      dVar6 = (dVar1 - dVar6) / dVar7 + dVar6;
      dVar5 = (dVar1 - dVar8) * (dVar1 - dVar6) + dVar5;
      dVar8 = 0.0;
      lVar4 = lVar3 + -1;
      if (lVar3 != 0) {
        dVar8 = SQRT(dVar5 / dVar7);
      }
      sd_arr[n + lVar3 + -1] = dVar8;
      lVar2 = lVar2 + 1;
      lVar3 = lVar4;
      dVar8 = dVar6;
    } while (1 - n != lVar4);
  }
  dVar1 = *x;
  auVar9._8_4_ = (int)(n >> 0x20);
  auVar9._0_8_ = n;
  auVar9._12_4_ = 0x45300000;
  dVar7 = (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0);
  return SQRT(((dVar1 - dVar8) * (dVar1 - ((dVar1 - dVar6) / dVar7 + dVar6)) + dVar5) / dVar7);
}

Assistant:

real_t calc_sd_right_to_left(real_t_ *restrict x, size_t n, double *restrict sd_arr)
{
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[n-1];
    for (size_t row = 0; row < n-1; row++)
    {
        running_mean   += (x[n-row-1] - running_mean) / (real_t)(row+1);
        running_ssq    += (x[n-row-1] - running_mean) * (x[n-row-1] - mean_prev);
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / (real_t)(row+1));
    }
    running_mean   += (x[0] - running_mean) / (real_t)n;
    running_ssq    += (x[0] - running_mean) * (x[0] - mean_prev);
    return std::sqrt(running_ssq / (real_t)n);
}